

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O3

StringView CpuFeatures_StringView_TrimWhitespace(StringView view)

{
  ushort **ppuVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  StringView SVar10;
  
  sVar3 = view.size;
  pcVar6 = view.ptr;
  if (sVar3 == 0) {
    sVar5 = 0;
    pcVar2 = pcVar6;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    pcVar2 = pcVar6 + sVar3;
    lVar8 = -sVar3;
    sVar5 = 0;
    pcVar7 = pcVar6;
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)*pcVar7 * 2 + 1) & 0x20) == 0) {
        ppuVar1 = __ctype_b_loc();
        sVar5 = 0;
        lVar4 = 0;
        goto LAB_001047db;
      }
      pcVar7 = pcVar7 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
  }
  goto LAB_00104802;
  while (bVar9 = lVar8 + 1 != lVar4, lVar4 = lVar4 + -1, bVar9) {
LAB_001047db:
    pcVar2 = pcVar7;
    if ((*(byte *)((long)*ppuVar1 + (long)pcVar6[lVar4 + (sVar3 - 1)] * 2 + 1) & 0x20) == 0) {
      sVar5 = lVar4 - lVar8;
      break;
    }
  }
LAB_00104802:
  SVar10.size = sVar5;
  SVar10.ptr = pcVar2;
  return SVar10;
}

Assistant:

StringView CpuFeatures_StringView_TrimWhitespace(StringView view) {
  while (view.size && isspace(CpuFeatures_StringView_Front(view)))
    view = CpuFeatures_StringView_PopFront(view, 1);
  while (view.size && isspace(CpuFeatures_StringView_Back(view)))
    view = CpuFeatures_StringView_PopBack(view, 1);
  return view;
}